

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusxml2cpp.cpp
# Opt level: O3

QByteArray * __thiscall
QDBusXmlToCpp::qtTypeName
          (QByteArray *__return_storage_ptr__,QDBusXmlToCpp *this,SourceLocation *location,
          QString *signature,Annotations *annotations,qsizetype paramId,char *direction)

{
  long lVar1;
  Data *pDVar2;
  qsizetype qVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  Data *pDVar7;
  char16_t *pcVar8;
  qint64 qVar9;
  int iVar10;
  QMetaTypeInterface *pQVar11;
  ulong uVar12;
  char *pcVar13;
  DiagnosticsReporter *this_00;
  long in_FS_OFFSET;
  QAnyStringView QVar14;
  QAnyStringView QVar15;
  QString local_158;
  QString local_140;
  Annotation local_128;
  Annotation local_e8;
  QString local_a0;
  Annotation local_88;
  Annotation *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QString::toLatin1_helper((QString *)&local_e8);
  pcVar13 = (char *)local_e8.location.columnNumber;
  if ((char *)local_e8.location.columnNumber == (char *)0x0) {
    pcVar13 = (char *)&QByteArray::_empty;
  }
  pQVar11 = (QMetaTypeInterface *)QDBusMetaType::signatureToMetaType(pcVar13);
  if (pQVar11 == (QMetaTypeInterface *)0x0) {
    iVar10 = 0;
  }
  else {
    iVar10 = (pQVar11->typeId)._q_value.super___atomic_base<int>._M_i;
    if (iVar10 == 0) {
      iVar10 = QMetaType::registerHelper(pQVar11);
    }
  }
  if ((QArrayData *)local_e8.location.lineNumber != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_e8.location.lineNumber)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_e8.location.lineNumber)->_q_value).super___atomic_base<int>._M_i
         + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_e8.location.lineNumber)->_q_value).super___atomic_base<int>._M_i
        == 0) {
      QArrayData::deallocate((QArrayData *)local_e8.location.lineNumber,1,0x10);
    }
  }
  if (iVar10 == 0) {
    local_a0.d.d = (Data *)0x0;
    local_a0.d.ptr = L"org.qtproject.QtDBus.QtTypeName";
    local_a0.d.size = 0x1f;
    if (-1 < paramId) {
      if (direction == (char *)0x0) {
        local_e8.name.d.d = (Data *)0x4000000000000000;
      }
      else {
        uVar12 = 0xffffffffffffffff;
        do {
          lVar1 = uVar12 + 1;
          uVar12 = uVar12 + 1;
        } while (direction[lVar1] != '\0');
        local_e8.name.d.d = (Data *)(uVar12 | 0x4000000000000000);
      }
      local_e8.location.lineNumber = CONCAT71(local_e8.location.lineNumber._1_7_,1);
      local_e8.location.columnNumber = (qint64)direction;
      local_88.location.columnNumber = 0;
      QVar14.m_size = (size_t)".%1%2";
      QVar14.field_0.m_data = &local_128;
      local_88.location.lineNumber = (qint64)&local_e8;
      QtPrivate::argToQString(QVar14,0x4000000000000005,(ArgBase **)0x1);
      QString::arg_impl((longlong)&local_e8,(int)&local_128,(int)paramId,(QChar)0x0);
      QString::append(&local_a0);
      if ((QArrayData *)local_e8.location.lineNumber != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_e8.location.lineNumber)->_q_value).super___atomic_base<int>._M_i
             = (((QBasicAtomicInt *)local_e8.location.lineNumber)->_q_value).
               super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_e8.location.lineNumber)->_q_value).super___atomic_base<int>.
            _M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_e8.location.lineNumber,2,0x10);
        }
      }
      if ((QArrayData *)local_128.location.lineNumber != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_128.location.lineNumber)->_q_value).super___atomic_base<int>._M_i
             = (((QBasicAtomicInt *)local_128.location.lineNumber)->_q_value).
               super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_128.location.lineNumber)->_q_value).super___atomic_base<int>.
            _M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_128.location.lineNumber,2,0x10);
        }
      }
    }
    local_e8.value.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_e8.value.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_e8.name.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_e8.value.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_e8.name.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_e8.name.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_e8.location.lineNumber = (qint64)&DAT_aaaaaaaaaaaaaaaa;
    local_e8.location.columnNumber = (qint64)&DAT_aaaaaaaaaaaaaaaa;
    local_128.location.lineNumber = 1;
    local_128.location.columnNumber = 0;
    local_128.name.d.d = (Data *)0x0;
    local_128.name.d.ptr = (char16_t *)0x0;
    local_128.name.d.size = 0;
    local_128.value.d.d = (Data *)0x0;
    local_128.value.d.ptr = (char16_t *)0x0;
    local_128.value.d.size = 0;
    QMap<QString,_QDBusIntrospection::Annotation>::value(&local_e8,annotations,&local_a0,&local_128)
    ;
    if (&(local_128.value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_128.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_128.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_128.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate(&(local_128.value.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_128.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_128.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_128.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_128.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_128.name.d.d)->super_QArrayData,2,0x10);
      }
    }
    local_140.d.d = local_e8.value.d.d;
    local_140.d.ptr = local_e8.value.d.ptr;
    local_140.d.size = local_e8.value.d.size;
    if (&(local_e8.value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_e8.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_e8.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((undefined1 *)local_e8.value.d.size == (undefined1 *)0x0) {
      local_158.d.d = (Data *)0x0;
      local_158.d.ptr = L"com.trolltech.QtDBus.QtTypeName";
      local_158.d.size = 0x1f;
      if (-1 < paramId) {
        if (direction == (char *)0x0) {
          local_128.name.d.d = (Data *)0x4000000000000000;
        }
        else {
          uVar12 = 0xffffffffffffffff;
          do {
            lVar1 = uVar12 + 1;
            uVar12 = uVar12 + 1;
          } while (direction[lVar1] != '\0');
          local_128.name.d.d = (Data *)(uVar12 | 0x4000000000000000);
        }
        local_128.location.lineNumber = CONCAT71(local_128.location.lineNumber._1_7_,1);
        local_128.location.columnNumber = (qint64)direction;
        local_40 = 0;
        QVar15.m_size = (size_t)".%1%2";
        QVar15.field_0.m_data = &local_88;
        local_48 = &local_128;
        QtPrivate::argToQString(QVar15,0x4000000000000005,(ArgBase **)0x1);
        QString::arg_impl((longlong)&local_128,(int)&local_88,(int)paramId,(QChar)0x0);
        QString::append(&local_158);
        if ((QArrayData *)local_128.location.lineNumber != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_128.location.lineNumber)->_q_value).super___atomic_base<int>.
          _M_i = (((QBasicAtomicInt *)local_128.location.lineNumber)->_q_value).
                 super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_128.location.lineNumber)->_q_value).
              super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_128.location.lineNumber,2,0x10);
          }
        }
        qVar9 = local_88.location.lineNumber;
        if ((Annotation *)local_88.location.lineNumber != (Annotation *)0x0) {
          LOCK();
          *(int *)&((DataPointer *)local_88.location.lineNumber)->d =
               *(int *)&((DataPointer *)local_88.location.lineNumber)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)qVar9)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_88.location.lineNumber,2,0x10);
          }
        }
      }
      local_88.location.lineNumber = 1;
      local_88.location.columnNumber = 0;
      local_88.name.d.d = (Data *)0x0;
      local_88.name.d.ptr = (char16_t *)0x0;
      local_88.name.d.size = 0;
      local_88.value.d.d = (Data *)0x0;
      local_88.value.d.ptr = (char16_t *)0x0;
      local_88.value.d.size = 0;
      QMap<QString,_QDBusIntrospection::Annotation>::value
                (&local_128,annotations,&local_158,&local_88);
      pcVar8 = local_e8.value.d.ptr;
      pDVar7 = local_e8.value.d.d;
      qVar6 = local_e8.name.d.size;
      pcVar5 = local_e8.name.d.ptr;
      pDVar4 = local_e8.name.d.d;
      qVar3 = local_128.value.d.size;
      pDVar2 = local_128.value.d.d;
      local_e8.location.lineNumber = local_128.location.lineNumber;
      local_e8.location.columnNumber = local_128.location.columnNumber;
      local_e8.name.d.d = local_128.name.d.d;
      local_e8.name.d.ptr = local_128.name.d.ptr;
      local_128.name.d.d = pDVar4;
      local_128.name.d.ptr = pcVar5;
      local_e8.name.d.size = local_128.name.d.size;
      local_128.name.d.size = qVar6;
      local_128.value.d.d = local_e8.value.d.d;
      local_e8.value.d.d = pDVar2;
      local_e8.value.d.ptr = local_128.value.d.ptr;
      local_128.value.d.ptr = pcVar8;
      local_128.value.d.size = local_e8.value.d.size;
      local_e8.value.d.size = qVar3;
      if (&pDVar7->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar7->super_QArrayData,2,0x10);
        }
      }
      if (&(local_128.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_128.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_128.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
             -1;
        UNLOCK();
        if (((local_128.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
            0) {
          QArrayData::deallocate(&(local_128.name.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_88.value.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
             -1;
        UNLOCK();
        if (((local_88.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
            0) {
          QArrayData::deallocate(&(local_88.value.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_88.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
             -1;
        UNLOCK();
        if (((local_88.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
           ) {
          QArrayData::deallocate(&(local_88.name.d.d)->super_QArrayData,2,0x10);
        }
      }
      QString::operator=(&local_140,&local_e8.value);
      this_00 = &this->reporter;
      if ((undefined1 *)local_140.d.size == (undefined1 *)0x0) {
        QString::toLocal8Bit((QByteArray *)&local_128,signature);
        pcVar13 = (char *)local_128.location.columnNumber;
        if ((char *)local_128.location.columnNumber == (char *)0x0) {
          pcVar13 = (char *)&QByteArray::_empty;
        }
        DiagnosticsReporter::error(this_00,location,"unknown type `%s\'\n",pcVar13);
        QByteArray::~QByteArray((QByteArray *)&local_128);
        QString::toLocal8Bit((QByteArray *)&local_128,&local_a0);
        pcVar13 = (char *)local_128.location.columnNumber;
        if ((char *)local_128.location.columnNumber == (char *)0x0) {
          pcVar13 = (char *)&QByteArray::_empty;
        }
        DiagnosticsReporter::note
                  (this_00,location,"you should add <annotation name=\"%s\" value=\"<type>\"/>\n",
                   pcVar13);
        QByteArray::~QByteArray((QByteArray *)&local_128);
        exit(1);
      }
      QString::toLocal8Bit_helper((QChar *)&local_128,(longlong)local_158.d.ptr);
      pcVar13 = (char *)local_128.location.columnNumber;
      if ((char *)local_128.location.columnNumber == (char *)0x0) {
        pcVar13 = (char *)&QByteArray::_empty;
      }
      DiagnosticsReporter::warning
                (this_00,&local_e8.location,"deprecated annotation \'%s\' found\n",pcVar13);
      if ((QArrayData *)local_128.location.lineNumber != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_128.location.lineNumber)->_q_value).super___atomic_base<int>._M_i
             = (((QBasicAtomicInt *)local_128.location.lineNumber)->_q_value).
               super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_128.location.lineNumber)->_q_value).super___atomic_base<int>.
            _M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_128.location.lineNumber,1,0x10);
        }
      }
      QString::toLocal8Bit_helper((QChar *)&local_128,(longlong)local_a0.d.ptr);
      pcVar13 = (char *)local_128.location.columnNumber;
      if ((char *)local_128.location.columnNumber == (char *)0x0) {
        pcVar13 = (char *)&QByteArray::_empty;
      }
      DiagnosticsReporter::note(this_00,&local_e8.location,"suggest updating to \'%s\'\n",pcVar13);
      if ((QArrayData *)local_128.location.lineNumber != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_128.location.lineNumber)->_q_value).super___atomic_base<int>._M_i
             = (((QBasicAtomicInt *)local_128.location.lineNumber)->_q_value).
               super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_128.location.lineNumber)->_q_value).super___atomic_base<int>.
            _M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_128.location.lineNumber,1,0x10);
        }
      }
      QString::toLatin1_helper_inplace((QString *)__return_storage_ptr__);
      if (&(local_158.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_158.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    else {
      QString::toLatin1_helper_inplace((QString *)__return_storage_ptr__);
    }
    if (&(local_140.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_140.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_140.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_140.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_140.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_e8.value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_e8.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_e8.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_e8.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_e8.value.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_e8.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_e8.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_e8.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_e8.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_e8.name.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_a0.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_a0.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    QMetaType::QMetaType((QMetaType *)&local_e8,iVar10);
    if ((QArrayData *)local_e8.location.lineNumber == (QArrayData *)0x0) {
      pcVar13 = (char *)0x0;
    }
    else {
      pcVar13 = (char *)((QArrayData *)(local_e8.location.lineNumber + 0x10))->alloc;
    }
    QByteArray::QByteArray(__return_storage_ptr__,pcVar13,-1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray QDBusXmlToCpp::qtTypeName(const QDBusIntrospection::SourceLocation &location,
                                     const QString &signature,
                                     const QDBusIntrospection::Annotations &annotations,
                                     qsizetype paramId, const char *direction)
{
    int type = QDBusMetaType::signatureToMetaType(signature.toLatin1()).id();
    if (type == QMetaType::UnknownType) {
        QString annotationName = u"org.qtproject.QtDBus.QtTypeName"_s;
        if (paramId >= 0)
            annotationName += ".%1%2"_L1.arg(QLatin1StringView(direction)).arg(paramId);
        auto annotation = annotations.value(annotationName);
        QString qttype = annotation.value;
        if (!qttype.isEmpty())
            return std::move(qttype).toLatin1();

        QString oldAnnotationName = u"com.trolltech.QtDBus.QtTypeName"_s;
        if (paramId >= 0)
            oldAnnotationName += ".%1%2"_L1.arg(QLatin1StringView(direction)).arg(paramId);
        annotation = annotations.value(oldAnnotationName);
        qttype = annotation.value;

        if (qttype.isEmpty()) {
            reporter.error(location, "unknown type `%s'\n", qPrintable(signature));
            reporter.note(location, "you should add <annotation name=\"%s\" value=\"<type>\"/>\n",
                          qPrintable(annotationName));

            exit(1);
        }

        reporter.warning(annotation.location, "deprecated annotation '%s' found\n",
                         qPrintable(oldAnnotationName));
        reporter.note(annotation.location, "suggest updating to '%s'\n",
                      qPrintable(annotationName));
        return std::move(qttype).toLatin1();
    }

    return QMetaType(type).name();
}